

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__poll_io_uring(uv_loop_t *loop,uv__iou *iou)

{
  uint32_t uVar1;
  uint uVar2;
  void *pvVar3;
  uv_fs_t *req_00;
  int iVar4;
  undefined8 *puVar5;
  int *piVar6;
  bool bVar7;
  int local_48;
  int rc;
  int nevents;
  uint32_t flags;
  uint32_t i;
  uint32_t mask;
  uint32_t tail;
  uint32_t head;
  uv_fs_t *req;
  uv__io_uring_cqe *e;
  uv__io_uring_cqe *cqe;
  uv__iou *iou_local;
  uv_loop_t *loop_local;
  
  nevents = *iou->cqhead;
  uVar1 = *iou->cqtail;
  uVar2 = iou->cqmask;
  pvVar3 = iou->cqe;
  local_48 = 0;
  while( true ) {
    if (nevents == uVar1) {
      *iou->cqhead = uVar1;
      if ((*iou->sqflags & 2) != 0) {
        do {
          iVar4 = uv__io_uring_enter(iou->ringfd,0,0,1);
          bVar7 = false;
          if (iVar4 == -1) {
            piVar6 = __errno_location();
            bVar7 = *piVar6 == 4;
          }
        } while (bVar7);
        if (iVar4 < 0) {
          perror("libuv: io_uring_enter(getevents)");
        }
      }
      *(long *)((long)loop->internal_fields + 0x10) =
           (long)local_48 + *(long *)((long)loop->internal_fields + 0x10);
      if (*(int *)((long)loop->internal_fields + 0xc0) == 0) {
        *(long *)((long)loop->internal_fields + 0x18) =
             (long)local_48 + *(long *)((long)loop->internal_fields + 0x18);
      }
      return;
    }
    puVar5 = (undefined8 *)((long)pvVar3 + (ulong)(nevents & uVar2) * 0x10);
    req_00 = (uv_fs_t *)*puVar5;
    if (req_00->type != UV_FS) break;
    if ((loop->active_reqs).count == 0) {
      __assert_fail("uv__has_active_reqs(loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                    ,0x486,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
    }
    (loop->active_reqs).count = (loop->active_reqs).count - 1;
    iou->in_flight = iou->in_flight - 1;
    if (*(int *)(puVar5 + 1) == -0x5f) {
      uv__fs_post(loop,req_00);
    }
    else {
      req_00->result = (long)*(int *)(puVar5 + 1);
      if ((uint)(req_00->fs_type + ~UV_FS_SENDFILE) < 3) {
        uv__iou_fs_statx_post(req_00);
      }
      uv__metrics_update_idle_time(loop);
      (*req_00->cb)(req_00);
      local_48 = local_48 + 1;
    }
    nevents = nevents + 1;
  }
  __assert_fail("req->type == UV_FS",
                "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                ,0x484,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
}

Assistant:

static void uv__poll_io_uring(uv_loop_t* loop, struct uv__iou* iou) {
  struct uv__io_uring_cqe* cqe;
  struct uv__io_uring_cqe* e;
  uv_fs_t* req;
  uint32_t head;
  uint32_t tail;
  uint32_t mask;
  uint32_t i;
  uint32_t flags;
  int nevents;
  int rc;

  head = *iou->cqhead;
  tail = atomic_load_explicit((_Atomic uint32_t*) iou->cqtail,
                              memory_order_acquire);
  mask = iou->cqmask;
  cqe = iou->cqe;
  nevents = 0;

  for (i = head; i != tail; i++) {
    e = &cqe[i & mask];

    req = (uv_fs_t*) (uintptr_t) e->user_data;
    assert(req->type == UV_FS);

    uv__req_unregister(loop, req);
    iou->in_flight--;

    /* If the op is not supported by the kernel retry using the thread pool */
    if (e->res == -EOPNOTSUPP) {
      uv__fs_post(loop, req);
      continue;
    }

    /* io_uring stores error codes as negative numbers, same as libuv. */
    req->result = e->res;

    switch (req->fs_type) {
      case UV_FS_FSTAT:
      case UV_FS_LSTAT:
      case UV_FS_STAT:
        uv__iou_fs_statx_post(req);
        break;
      default:  /* Squelch -Wswitch warnings. */
        break;
    }

    uv__metrics_update_idle_time(loop);
    req->cb(req);
    nevents++;
  }

  atomic_store_explicit((_Atomic uint32_t*) iou->cqhead,
                        tail,
                        memory_order_release);

  /* Check whether CQE's overflowed, if so enter the kernel to make them
   * available. Don't grab them immediately but in the next loop iteration to
   * avoid loop starvation. */
  flags = atomic_load_explicit((_Atomic uint32_t*) iou->sqflags,
                               memory_order_acquire);

  if (flags & UV__IORING_SQ_CQ_OVERFLOW) {
    do
      rc = uv__io_uring_enter(iou->ringfd, 0, 0, UV__IORING_ENTER_GETEVENTS);
    while (rc == -1 && errno == EINTR);

    if (rc < 0)
      perror("libuv: io_uring_enter(getevents)");  /* Can't happen. */
  }

  uv__metrics_inc_events(loop, nevents);
  if (uv__get_internal_fields(loop)->current_timeout == 0)
    uv__metrics_inc_events_waiting(loop, nevents);
}